

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

pair<QArrayData_*,_void_*>
QArrayData::reallocateUnaligned
          (QArrayData *data,void *dataPointer,qsizetype objectSize,qsizetype capacity,
          AllocationOption option)

{
  ulong headerSize;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  QArrayData *pQVar5;
  size_t __size;
  void *pvVar6;
  long lVar7;
  pair<QArrayData_*,_void_*> pVar8;
  CalculateGrowingBlockSizeResult CVar9;
  
  headerSize = (ulong)(objectSize < 3) * 2 + 0x10;
  if (option == Grow) {
    CVar9 = qCalculateGrowingBlockSize(capacity,objectSize,headerSize);
    capacity = CVar9.elementCount;
    __size = CVar9.size;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = objectSize;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = capacity;
    uVar3 = SUB168(auVar1 * auVar2,0);
    __size = 0xffffffffffffffff;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      sVar4 = uVar3 + headerSize;
      if ((!CARRY8(uVar3,headerSize)) && (-1 < (long)sVar4)) {
        __size = sVar4;
      }
    }
  }
  if ((long)__size < 0) {
    pvVar6 = (void *)0x0;
    pQVar5 = (QArrayData *)0x0;
  }
  else {
    pQVar5 = (QArrayData *)realloc(data,__size);
    if (pQVar5 == (QArrayData *)0x0) {
      pvVar6 = (void *)0x0;
    }
    else {
      lVar7 = 0x10;
      if (dataPointer != (void *)0x0) {
        lVar7 = (long)dataPointer - (long)data;
      }
      pQVar5->alloc = capacity;
      pvVar6 = (void *)((long)&(pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + lVar7);
    }
  }
  pVar8.second = pvVar6;
  pVar8.first = pQVar5;
  return pVar8;
}

Assistant:

std::pair<QArrayData *, void *>
QArrayData::reallocateUnaligned(QArrayData *data, void *dataPointer,
                                qsizetype objectSize, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(!data || !data->isShared());

    const qsizetype headerSize = sizeof(AlignedQArrayData);
    auto r = calculateBlockSize(capacity, objectSize, headerSize, option);
    qsizetype allocSize = r.size;
    capacity = r.elementCount;
    if (Q_UNLIKELY(allocSize < 0))
        return {};

    const qptrdiff offset = dataPointer
            ? reinterpret_cast<char *>(dataPointer) - reinterpret_cast<char *>(data)
            : headerSize;
    Q_ASSERT(offset > 0);
    Q_ASSERT(offset <= allocSize); // equals when all free space is at the beginning

    QArrayData *header = static_cast<QArrayData *>(::realloc(data, size_t(allocSize)));
    if (header) {
        header->alloc = capacity;
        dataPointer = reinterpret_cast<char *>(header) + offset;
    } else {
        dataPointer = nullptr;
    }
    return {header, dataPointer};
}